

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Variable __thiscall
LiteScript::Class::CreateElement
          (Class *this,State *state,
          vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args,Variable *self)

{
  ClassObject *this_00;
  bool bVar1;
  Object *pOVar2;
  size_type sVar3;
  reference pvVar4;
  Type *pTVar5;
  char *name;
  Callback *pCVar6;
  uint *extraout_RDX;
  Variable *in_R8;
  Variable VVar7;
  Variable local_b8;
  Nullable<LiteScript::Variable> local_a8;
  undefined1 local_88 [32];
  undefined1 local_68 [24];
  uint sz;
  uint j;
  uint i;
  ClassObject *local_40;
  ClassObject *co;
  Variable *local_30;
  Variable *self_local;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *args_local;
  State *state_local;
  Class *this_local;
  Variable *v;
  
  co._7_1_ = 0;
  local_30 = in_R8;
  self_local = self;
  args_local = args;
  state_local = state;
  this_local = this;
  Memory::Create((Memory *)this,
                 (Type *)state[4].call_lifo.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  pOVar2 = Variable::operator->((Variable *)this);
  local_40 = Object::GetData<LiteScript::ClassObject>(pOVar2);
  local_40->ClassBase = (Class *)state;
  sz = 0;
  local_68._20_4_ = 0;
  sVar3 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
          ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                  *)&state->args_tmp);
  local_68._16_4_ = (undefined4)sVar3;
  for (; sz < (uint)local_68._16_4_; sz = sz + 1) {
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                           *)&state->args_tmp,(ulong)sz);
    pOVar2 = Variable::operator->(&pvVar4->second);
    pTVar5 = Object::GetType(pOVar2);
    bVar1 = Type::operator!=(pTVar5,(Type *)_type_callback);
    this_00 = local_40;
    if (bVar1) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                    *)&state->args_tmp,(ulong)sz);
      name = (char *)std::__cxx11::string::c_str();
      Memory::Create((Memory *)local_68,
                     (Type *)state[4].call_lifo.
                             super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
      ClassObject::AddMember(this_00,name,(Variable *)local_68);
      Variable::~Variable((Variable *)local_68);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                    *)&state->args_tmp,(ulong)sz);
      ClassObject::GetMemberVariable((ClassObject *)local_88,(uint)local_40);
      Variable::operator=((Variable *)(local_88 + 0x10),(Variable *)local_88);
      Variable::~Variable((Variable *)(local_88 + 0x10));
      Variable::~Variable((Variable *)local_88);
      local_68._20_4_ = local_68._20_4_ + 1;
    }
  }
  if (*(int *)&state[4].call_lifo.
               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start != -1) {
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                           *)&state->args_tmp,
                          (long)*(int *)&state[4].call_lifo.
                                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    pOVar2 = Variable::operator->(&pvVar4->second);
    pTVar5 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar5,(Type *)_type_callback);
    if (bVar1) {
      Nullable<LiteScript::Variable>::Nullable(&local_a8,(Variable *)this);
      pvVar4 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                             *)&state->args_tmp,
                            (long)*(int *)&state[4].call_lifo.
                                           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
      pOVar2 = Variable::operator->(&pvVar4->second);
      pCVar6 = Object::GetData<LiteScript::Callback>(pOVar2);
      Nullable<LiteScript::Variable>::operator=(&pCVar6->This,&local_a8);
      Nullable<LiteScript::Variable>::~Nullable(&local_a8);
      pvVar4 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                             *)&state->args_tmp,
                            (long)*(int *)&state[4].call_lifo.
                                           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
      Variable::operator()(&local_b8,(State *)&pvVar4->second,args_local);
      Variable::~Variable(&local_b8);
    }
  }
  local_40->ScriptState = (State *)args_local;
  Nullable<LiteScript::Variable>::operator=(&local_40->class_base,local_30);
  VVar7.nb_ref = extraout_RDX;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::Class::CreateElement(State& state, std::vector<Variable>& args, const Variable& self) {
    Variable v = this->memory.Create(Type::CLASS_OBJECT);
    ClassObject& co = v->GetData<ClassObject>();
    co.ClassBase = this;
    for (unsigned int i = 0, j = 0, sz = this->us_members.size(); i < sz; i++) {
        if (this->us_members[i].second->GetType() != Type::CALLBACK) {
            co.AddMember(this->us_members[i].first.c_str(), this->memory.Create(Type::NIL));
            co.GetMemberVariable(j) = this->us_members[i].second;
            j++;
        }
    }
    if (this->constructor_index != -1 && this->us_members[this->constructor_index].second->GetType() == Type::CALLBACK) {
        this->us_members[this->constructor_index].second->GetData<Callback>().This = Nullable<Variable>(v);
        this->us_members[this->constructor_index].second(state, args);
    }
    co.ScriptState = &state;
    co.class_base = self;
    return v;
}